

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

numtree_number __thiscall QPDFNumberTreeObjectHelper::getMin(QPDFNumberTreeObjectHelper *this)

{
  bool bVar1;
  pointer pTVar2;
  iterator local_78;
  undefined1 local_48 [8];
  iterator i;
  QPDFNumberTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  begin((iterator *)local_48,this);
  end(&local_78,this);
  bVar1 = iterator::operator==((iterator *)local_48,&local_78);
  iterator::~iterator(&local_78);
  if (bVar1) {
    this_local = (QPDFNumberTreeObjectHelper *)0x0;
  }
  else {
    pTVar2 = iterator::operator->((iterator *)local_48);
    this_local = (QPDFNumberTreeObjectHelper *)pTVar2->first;
  }
  iterator::~iterator((iterator *)local_48);
  return (numtree_number)this_local;
}

Assistant:

QPDFNumberTreeObjectHelper::numtree_number
QPDFNumberTreeObjectHelper::getMin()
{
    auto i = begin();
    if (i == end()) {
        return 0;
    }
    return i->first;
}